

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O0

void __thiscall wasm::MultiMemoryLowering::removeExistingMemories(MultiMemoryLowering *this)

{
  Module *this_00;
  anon_class_1_0_00000001 local_31;
  function<bool_(wasm::Memory_*)> local_30;
  MultiMemoryLowering *local_10;
  MultiMemoryLowering *this_local;
  
  this_00 = this->wasm;
  local_10 = this;
  std::function<bool(wasm::Memory*)>::
  function<wasm::MultiMemoryLowering::removeExistingMemories()::_lambda(wasm::Memory*)_1_,void>
            ((function<bool(wasm::Memory*)> *)&local_30,&local_31);
  Module::removeMemories(this_00,&local_30);
  std::function<bool_(wasm::Memory_*)>::~function(&local_30);
  return;
}

Assistant:

void removeExistingMemories() {
    wasm->removeMemories([&](Memory* curr) { return true; });
  }